

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O0

BrInstr * __thiscall
flow::IRBuilder::insert<flow::BrInstr,flow::BasicBlock*&>(IRBuilder *this,BasicBlock **args)

{
  Instr *pIVar1;
  unique_ptr<flow::BrInstr,_std::default_delete<flow::BrInstr>_> local_28;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> local_20;
  BasicBlock **local_18;
  BasicBlock **args_local;
  IRBuilder *this_local;
  
  local_18 = args;
  args_local = (BasicBlock **)this;
  std::make_unique<flow::BrInstr,flow::BasicBlock*>((BasicBlock **)&local_28);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::BrInstr,std::default_delete<flow::BrInstr>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)&local_20,&local_28);
  pIVar1 = insert(this,&local_20);
  std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr(&local_20);
  std::unique_ptr<flow::BrInstr,_std::default_delete<flow::BrInstr>_>::~unique_ptr(&local_28);
  return (BrInstr *)pIVar1;
}

Assistant:

T* insert(Args&&... args) {
    return static_cast<T*>(insert(std::make_unique<T>(std::move(args)...)));
  }